

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportFileGenerator::PopulateCxxModuleExportProperties
          (cmExportFileGenerator *this,cmGeneratorTarget *gte,ImportPropertyMap *properties,
          PreprocessContext ctx,string *includesDestinationDirs,string *errorMessage)

{
  cmTarget *pcVar1;
  bool bVar2;
  cmMakefile *pcVar3;
  string *psVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  undefined1 local_290 [8];
  string value;
  string exportedPropName_1;
  cmValue local_248;
  cmValue prop_2;
  undefined1 local_238 [8];
  string propNameStr_2;
  static_string_view *propName_1;
  static_string_view *__end1_2;
  static_string_view *__begin1_2;
  static_string_view (*__range1_2) [1];
  static_string_view exportedLinkModuleProperties [1];
  string local_1e0;
  undefined1 local_1c0 [8];
  string exportedPropName;
  cmValue local_198;
  cmValue prop_1;
  undefined1 local_188 [8];
  string propNameStr_1;
  ModulePropertyTable *propEntry;
  ModulePropertyTable *__end1_1;
  ModulePropertyTable *__begin1_1;
  ModulePropertyTable (*__range1_1) [4];
  ModulePropertyTable exportedModuleProperties [4];
  string local_e0;
  string *local_c0;
  cmValue local_b8;
  cmValue prop;
  allocator<char> local_99;
  undefined1 local_98 [8];
  string propNameStr;
  static_string_view *propName;
  static_string_view *__end1;
  static_string_view *__begin1;
  static_string_view (*__range1) [1];
  static_string_view exportedDirectModuleProperties [1];
  string *errorMessage_local;
  string *includesDestinationDirs_local;
  PreprocessContext ctx_local;
  ImportPropertyMap *properties_local;
  cmGeneratorTarget *gte_local;
  cmExportFileGenerator *this_local;
  
  bVar2 = cmGeneratorTarget::HaveCxx20ModuleSources(gte,errorMessage);
  if (bVar2) {
    ___range1 = (string_view)::cm::operator____s("CXX_EXTENSIONS",0xe);
    for (__end1 = (static_string_view *)&__range1;
        __end1 != (static_string_view *)&exportedDirectModuleProperties[0].super_string_view._M_str;
        __end1 = __end1 + 1) {
      propNameStr.field_2._8_8_ = __end1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<cm::static_string_view,void>((string *)local_98,__end1,&local_99)
      ;
      std::allocator<char>::~allocator(&local_99);
      pcVar1 = gte->Target;
      pcVar3 = cmTarget::GetMakefile(pcVar1);
      local_b8 = cmTarget::GetComputedProperty(pcVar1,(string *)local_98,pcVar3);
      bVar2 = cmValue::operator_cast_to_bool(&local_b8);
      if (!bVar2) {
        local_c0 = (string *)cmTarget::GetProperty(gte->Target,(string *)local_98);
        local_b8 = (cmValue)local_c0;
      }
      bVar2 = cmValue::operator_cast_to_bool(&local_b8);
      if (bVar2) {
        psVar4 = cmValue::operator*[abi_cxx11_(&local_b8);
        cmGeneratorExpression::Preprocess(&local_e0,psVar4,ctx,false);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,(key_type *)local_98);
        std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
      }
      std::__cxx11::string::~string((string *)local_98);
    }
    ___range1_1 = (string_view)::cm::operator____s("INCLUDE_DIRECTORIES",0x13);
    exportedModuleProperties[0].Name.super_string_view._M_str._0_4_ = 2;
    exportedModuleProperties._16_16_ =
         (undefined1  [16])::cm::operator____s("COMPILE_DEFINITIONS",0x13);
    exportedModuleProperties[1].Name.super_string_view._M_str._0_4_ = 0;
    exportedModuleProperties._40_16_ = (undefined1  [16])::cm::operator____s("COMPILE_OPTIONS",0xf);
    exportedModuleProperties[2].Name.super_string_view._M_str._0_4_ = 0;
    exportedModuleProperties._64_16_ =
         (undefined1  [16])::cm::operator____s("COMPILE_FEATURES",0x10);
    exportedModuleProperties[3].Name.super_string_view._M_str._0_4_ = 0;
    for (__end1_1 = (ModulePropertyTable *)&__range1_1;
        __end1_1 != (ModulePropertyTable *)&exportedModuleProperties[3].Type;
        __end1_1 = __end1_1 + 1) {
      propNameStr_1.field_2._8_8_ = __end1_1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<cm::static_string_view,void>
                ((string *)local_188,&__end1_1->Name,(allocator<char> *)((long)&prop_1.Value + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&prop_1.Value + 7));
      pcVar1 = gte->Target;
      pcVar3 = cmTarget::GetMakefile(pcVar1);
      local_198 = cmTarget::GetComputedProperty(pcVar1,(string *)local_188,pcVar3);
      bVar2 = cmValue::operator_cast_to_bool(&local_198);
      if (!bVar2) {
        exportedPropName.field_2._8_8_ = cmTarget::GetProperty(gte->Target,(string *)local_188);
        local_198 = (cmValue)exportedPropName.field_2._8_8_;
      }
      bVar2 = cmValue::operator_cast_to_bool(&local_198);
      if (bVar2) {
        cmStrCat<char_const(&)[22],cm::static_string_view_const&>
                  ((string *)local_1c0,(char (*) [22])0x107982d,
                   (static_string_view *)propNameStr_1.field_2._8_8_);
        psVar4 = cmValue::operator*[abi_cxx11_(&local_198);
        cmGeneratorExpression::Preprocess(&local_1e0,psVar4,ctx,false);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,(key_type *)local_1c0);
        std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_1e0);
        if ((ctx == InstallInterface) &&
           (bVar2 = anon_unknown.dwarf_1116e50::PropertyTypeIsForPaths
                              (*(PropertyType *)(propNameStr_1.field_2._8_8_ + 0x10)), bVar2)) {
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](properties,(key_type *)local_1c0);
          (*this->_vptr_cmExportFileGenerator[0x14])(this,pmVar5);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](properties,(key_type *)local_1c0);
          prefixItems(pmVar5);
          if ((*(int *)(propNameStr_1.field_2._8_8_ + 0x10) == 2) &&
             (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](properties,(key_type *)local_1c0);
            uVar6 = std::__cxx11::string::empty();
            if ((uVar6 & 1) == 0) {
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](properties,(key_type *)local_1c0);
              std::__cxx11::string::operator+=((string *)pmVar5,';');
            }
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](properties,(key_type *)local_1c0);
            std::__cxx11::string::operator+=((string *)pmVar5,(string *)includesDestinationDirs);
          }
        }
        std::__cxx11::string::~string((string *)local_1c0);
      }
      std::__cxx11::string::~string((string *)local_188);
    }
    ___range1_2 = (string_view)::cm::operator____s("LINK_LIBRARIES",0xe);
    for (__end1_2 = (static_string_view *)&__range1_2;
        __end1_2 != (static_string_view *)&exportedLinkModuleProperties[0].super_string_view._M_str;
        __end1_2 = __end1_2 + 1) {
      propNameStr_2.field_2._8_8_ = __end1_2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<cm::static_string_view,void>
                ((string *)local_238,__end1_2,(allocator<char> *)((long)&prop_2.Value + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&prop_2.Value + 7));
      pcVar1 = gte->Target;
      pcVar3 = cmTarget::GetMakefile(pcVar1);
      local_248 = cmTarget::GetComputedProperty(pcVar1,(string *)local_238,pcVar3);
      bVar2 = cmValue::operator_cast_to_bool(&local_248);
      if (!bVar2) {
        local_248 = cmTarget::GetProperty(gte->Target,(string *)local_238);
      }
      bVar2 = cmValue::operator_cast_to_bool(&local_248);
      if (bVar2) {
        cmStrCat<char_const(&)[22],cm::static_string_view_const&>
                  ((string *)((long)&value.field_2 + 8),(char (*) [22])0x107982d,
                   (static_string_view *)propNameStr_2.field_2._8_8_);
        psVar4 = cmValue::operator*[abi_cxx11_(&local_248);
        cmGeneratorExpression::Preprocess((string *)local_290,psVar4,ctx,false);
        ResolveTargetsInGeneratorExpressions(this,(string *)local_290,gte,ReplaceFreeTargets);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,(key_type *)((long)&value.field_2 + 8));
        std::__cxx11::string::operator=((string *)pmVar5,(string *)local_290);
        std::__cxx11::string::~string((string *)local_290);
        std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::~string((string *)local_238);
    }
  }
  return true;
}

Assistant:

bool cmExportFileGenerator::PopulateCxxModuleExportProperties(
  cmGeneratorTarget const* gte, ImportPropertyMap& properties,
  cmGeneratorExpression::PreprocessContext ctx,
  std::string const& includesDestinationDirs, std::string& errorMessage)
{
  if (!gte->HaveCxx20ModuleSources(&errorMessage)) {
    return true;
  }

  const cm::static_string_view exportedDirectModuleProperties[] = {
    "CXX_EXTENSIONS"_s,
  };
  for (auto const& propName : exportedDirectModuleProperties) {
    auto const propNameStr = std::string(propName);
    cmValue prop = gte->Target->GetComputedProperty(
      propNameStr, *gte->Target->GetMakefile());
    if (!prop) {
      prop = gte->Target->GetProperty(propNameStr);
    }
    if (prop) {
      properties[propNameStr] = cmGeneratorExpression::Preprocess(*prop, ctx);
    }
  }

  const ModulePropertyTable exportedModuleProperties[] = {
    { "INCLUDE_DIRECTORIES"_s, PropertyType::IncludePaths },
    { "COMPILE_DEFINITIONS"_s, PropertyType::Strings },
    { "COMPILE_OPTIONS"_s, PropertyType::Strings },
    { "COMPILE_FEATURES"_s, PropertyType::Strings },
  };
  for (auto const& propEntry : exportedModuleProperties) {
    auto const propNameStr = std::string(propEntry.Name);
    cmValue prop = gte->Target->GetComputedProperty(
      propNameStr, *gte->Target->GetMakefile());
    if (!prop) {
      prop = gte->Target->GetProperty(propNameStr);
    }
    if (prop) {
      auto const exportedPropName =
        cmStrCat("IMPORTED_CXX_MODULES_", propEntry.Name);
      properties[exportedPropName] =
        cmGeneratorExpression::Preprocess(*prop, ctx);
      if (ctx == cmGeneratorExpression::InstallInterface &&
          PropertyTypeIsForPaths(propEntry.Type)) {
        this->ReplaceInstallPrefix(properties[exportedPropName]);
        prefixItems(properties[exportedPropName]);
        if (propEntry.Type == PropertyType::IncludePaths &&
            !includesDestinationDirs.empty()) {
          if (!properties[exportedPropName].empty()) {
            properties[exportedPropName] += ';';
          }
          properties[exportedPropName] += includesDestinationDirs;
        }
      }
    }
  }

  const cm::static_string_view exportedLinkModuleProperties[] = {
    "LINK_LIBRARIES"_s,
  };
  for (auto const& propName : exportedLinkModuleProperties) {
    auto const propNameStr = std::string(propName);
    cmValue prop = gte->Target->GetComputedProperty(
      propNameStr, *gte->Target->GetMakefile());
    if (!prop) {
      prop = gte->Target->GetProperty(propNameStr);
    }
    if (prop) {
      auto const exportedPropName =
        cmStrCat("IMPORTED_CXX_MODULES_", propName);
      auto value = cmGeneratorExpression::Preprocess(*prop, ctx);
      this->ResolveTargetsInGeneratorExpressions(
        value, gte, cmExportFileGenerator::ReplaceFreeTargets);
      properties[exportedPropName] = value;
    }
  }

  return true;
}